

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O1

void I422ToARGB4444Row_C(uint8_t *src_y,uint8_t *src_u,uint8_t *src_v,uint8_t *dst_argb4444,
                        YuvConstants *yuvconstants,int width)

{
  short sVar1;
  short sVar2;
  short sVar3;
  byte bVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  int br;
  int bg;
  int bb;
  
  if (1 < width) {
    sVar1 = yuvconstants->kUVBiasB[0];
    sVar2 = yuvconstants->kUVBiasG[0];
    sVar3 = yuvconstants->kUVBiasR[0];
    iVar6 = yuvconstants->kYToRgb[0] * 0x101;
    iVar15 = 0;
    do {
      uVar13 = (uint)*src_y * iVar6 >> 0x10;
      iVar11 = (int)sVar1 - (int)yuvconstants->kUVToB[0] * (uint)*src_u;
      uVar5 = (int)(iVar11 + uVar13) >> 6;
      if ((int)uVar5 < 1) {
        uVar5 = 0;
      }
      if (0xfe < (int)uVar5) {
        uVar5 = 0xff;
      }
      iVar8 = (int)sVar2 -
              ((int)yuvconstants->kUVToG[1] * (uint)*src_v +
              (int)yuvconstants->kUVToG[0] * (uint)*src_u);
      iVar14 = iVar8 + uVar13;
      if (iVar14 >> 6 < 1) {
        iVar14 = 0;
      }
      uVar10 = iVar14 >> 6;
      if (0xfe < (int)uVar10) {
        uVar10 = 0xff;
      }
      iVar14 = (int)sVar3 - (int)yuvconstants->kUVToR[1] * (uint)*src_v;
      uVar13 = (int)(uVar13 + iVar14) >> 6;
      if ((int)uVar13 < 1) {
        uVar13 = 0;
      }
      if (0xfe < (int)uVar13) {
        uVar13 = 0xff;
      }
      uVar7 = (uint)src_y[1] * iVar6 >> 0x10;
      uVar12 = (int)(iVar11 + uVar7) >> 6;
      if ((int)uVar12 < 1) {
        uVar12 = 0;
      }
      if (0xfe < (int)uVar12) {
        uVar12 = 0xff;
      }
      iVar8 = iVar8 + uVar7;
      if (iVar8 >> 6 < 1) {
        iVar8 = 0;
      }
      uVar9 = iVar8 >> 6;
      if (0xfe < (int)uVar9) {
        uVar9 = 0xff;
      }
      uVar7 = (int)(uVar7 + iVar14) >> 6;
      if ((int)uVar7 < 1) {
        uVar7 = 0;
      }
      if (0xfe < (int)uVar7) {
        uVar7 = 0xff;
      }
      *(uint *)dst_argb4444 =
           (uVar7 & 0xf0) << 0x14 | (uVar9 & 0xf0) << 0x10 |
           uVar12 << 0xc | (uVar13 & 0xf0) << 4 | uVar10 & 0xf0 | uVar5 >> 4 | 0xf000f000;
      src_y = src_y + 2;
      src_u = src_u + 1;
      src_v = src_v + 1;
      dst_argb4444 = (uint8_t *)((long)dst_argb4444 + 4);
      iVar15 = iVar15 + 2;
    } while (iVar15 < width + -1);
  }
  if ((width & 1U) != 0) {
    uVar5 = (int)yuvconstants->kYToRgb[0] * (uint)*src_y * 0x101 >> 0x10;
    iVar6 = (int)(((int)yuvconstants->kUVBiasB[0] - (int)yuvconstants->kUVToB[0] * (uint)*src_u) +
                 uVar5) >> 6;
    iVar15 = 0;
    if (iVar6 < 1) {
      iVar6 = iVar15;
    }
    bVar4 = (byte)iVar6;
    if (0xfe < iVar6) {
      bVar4 = 0xff;
    }
    iVar6 = (int)(((int)yuvconstants->kUVBiasG[0] -
                  ((int)yuvconstants->kUVToG[1] * (uint)*src_v +
                  (int)yuvconstants->kUVToG[0] * (uint)*src_u)) + uVar5) >> 6;
    if (iVar6 < 1) {
      iVar6 = iVar15;
    }
    if (0xfe < iVar6) {
      iVar6 = 0xff;
    }
    iVar11 = (int)(((int)yuvconstants->kUVBiasR[0] - (int)yuvconstants->kUVToR[1] * (uint)*src_v) +
                  uVar5) >> 6;
    if (iVar11 < 1) {
      iVar11 = iVar15;
    }
    if (0xfe < iVar11) {
      iVar11 = 0xff;
    }
    *(ushort *)dst_argb4444 =
         (ushort)(byte)((byte)iVar6 & 0xf0 | bVar4 >> 4) + ((ushort)iVar11 & 0xf0) * 0x10 + -0x1000;
  }
  return;
}

Assistant:

void I422ToARGB4444Row_C(const uint8_t* src_y,
                         const uint8_t* src_u,
                         const uint8_t* src_v,
                         uint8_t* dst_argb4444,
                         const struct YuvConstants* yuvconstants,
                         int width) {
  uint8_t b0;
  uint8_t g0;
  uint8_t r0;
  uint8_t b1;
  uint8_t g1;
  uint8_t r1;
  int x;
  for (x = 0; x < width - 1; x += 2) {
    YuvPixel(src_y[0], src_u[0], src_v[0], &b0, &g0, &r0, yuvconstants);
    YuvPixel(src_y[1], src_u[0], src_v[0], &b1, &g1, &r1, yuvconstants);
    b0 = b0 >> 4;
    g0 = g0 >> 4;
    r0 = r0 >> 4;
    b1 = b1 >> 4;
    g1 = g1 >> 4;
    r1 = r1 >> 4;
    *(uint32_t*)(dst_argb4444) = b0 | (g0 << 4) | (r0 << 8) | (b1 << 16) |
                                 (g1 << 20) | (r1 << 24) | 0xf000f000;
    src_y += 2;
    src_u += 1;
    src_v += 1;
    dst_argb4444 += 4;  // Advance 2 pixels.
  }
  if (width & 1) {
    YuvPixel(src_y[0], src_u[0], src_v[0], &b0, &g0, &r0, yuvconstants);
    b0 = b0 >> 4;
    g0 = g0 >> 4;
    r0 = r0 >> 4;
    *(uint16_t*)(dst_argb4444) = b0 | (g0 << 4) | (r0 << 8) | 0xf000;
  }
}